

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

RgbaChannels __thiscall Imf_3_4::RgbaOutputFile::channels(RgbaOutputFile *this)

{
  RgbaChannels RVar1;
  long in_RDI;
  string *in_stack_00000158;
  ChannelList *in_stack_00000160;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  OutputFile::header(*(OutputFile **)(in_RDI + 8));
  Header::channels((Header *)0x21fd3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  RVar1 = anon_unknown_1::rgbaChannels(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return RVar1;
}

Assistant:

RgbaChannels
RgbaOutputFile::channels () const
{
    return rgbaChannels (_outputFile->header ().channels ());
}